

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

IVec2 __thiscall
deqp::gles3::Functional::TriangleDerivateCase::getViewportSize(TriangleDerivateCase *this)

{
  int iVar1;
  RenderTarget *pRVar2;
  int iVar3;
  long in_RSI;
  
  if (*(int *)(in_RSI + 0xe8) == 0) {
    pRVar2 = Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
    iVar3 = 0xa7;
    if (pRVar2->m_width < 0xa7) {
      iVar3 = pRVar2->m_width;
    }
    pRVar2 = Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
    iVar1 = 0x67;
    if (pRVar2->m_height < 0x67) {
      iVar1 = pRVar2->m_height;
    }
  }
  else {
    iVar3 = 99;
    iVar1 = 0x85;
  }
  *(int *)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = iVar3;
  *(int *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar1;
  return (IVec2)(int  [2])this;
}

Assistant:

inline tcu::IVec2 TriangleDerivateCase::getViewportSize (void) const
{
	if (m_surfaceType == SURFACETYPE_DEFAULT_FRAMEBUFFER)
	{
		const int	width	= de::min<int>(m_context.getRenderTarget().getWidth(),	VIEWPORT_WIDTH);
		const int	height	= de::min<int>(m_context.getRenderTarget().getHeight(),	VIEWPORT_HEIGHT);
		return tcu::IVec2(width, height);
	}
	else
		return tcu::IVec2(FBO_WIDTH, FBO_HEIGHT);
}